

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>::on_bin
          (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>
           *this)

{
  char cVar1;
  uint uVar2;
  basic_format_specs<char> *pbVar3;
  anon_class_16_2_cb75083a_for_f_conflict f;
  int num_digits;
  back_insert_iterator<fmt::v6::detail::buffer<char>_> bVar4;
  string_view prefix;
  undefined4 uStack_c;
  
  pbVar3 = this->specs;
  if ((char)pbVar3->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = pbVar3->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  num_digits = count_digits<1u,unsigned_long>(this->abs_value);
  f._12_4_ = uStack_c;
  f.num_digits = num_digits;
  f.this = this;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  bVar4 = write_int<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,fmt::v6::detail::int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned_long>::on_bin()::_lambda(char*)_1_>
                    ((this->out).container,num_digits,prefix,this->specs,f);
  (this->out).container = bVar4.container;
  return;
}

Assistant:

void on_bin() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = static_cast<char>(specs.type);
    }
    int num_digits = count_digits<1>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<1, Char>(it, abs_value, num_digits);
                    });
  }